

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_fixed_suite::fixed_size(void)

{
  initializer_list<int> input;
  size_type local_78 [3];
  undefined4 local_5c;
  int array [4];
  circular_view<int,_4UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.size = 0;
  span.member.next = 4;
  local_78[0] = 0;
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x351,"void api_fixed_suite::fixed_size()",local_78,&local_5c);
  local_78[0] = 0x160000000b;
  local_78[1] = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)local_78;
  vista::circular_view<int,_4UL>::assign(&span,input);
  local_78[0] = span.member.size;
  local_5c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x353,"void api_fixed_suite::fixed_size()",local_78,&local_5c);
  vista::circular_view<int,_4UL>::push_back(&span,0x37);
  local_78[0] = span.member.size;
  local_5c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x355,"void api_fixed_suite::fixed_size()",local_78,&local_5c);
  return;
}

Assistant:

void fixed_size()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    BOOST_TEST_EQ(span.size(), 0);
    span = {11, 22, 33, 44};
    BOOST_TEST_EQ(span.size(), 4);
    span.push_back(55);
    BOOST_TEST_EQ(span.size(), 4);
}